

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexerScanner.cpp
# Opt level: O1

bool __thiscall LexerScanner::checkString(LexerScanner *this,char *c,int flags)

{
  byte bVar1;
  char *__s1;
  int iVar2;
  size_t __n;
  bool bVar3;
  
  __s1 = this->m_position;
  __n = strlen(c);
  iVar2 = strncmp(__s1,c,__n);
  bVar3 = iVar2 == 0;
  if ((flags & 1U) != 0 && bVar3) {
    bVar1 = __s1[__n];
    if ((byte)(bVar1 - 0x30) < 10) {
      bVar3 = false;
    }
    else {
      bVar3 = bVar1 != 0x5f && (byte)((bVar1 & 0xdf) + 0xa5) < 0xe6;
    }
    bVar3 = (bool)(iVar2 == 0 & bVar3);
  }
  if (((flags & 2U) == 0) && (bVar3 != false)) {
    this->m_position = __s1 + __n;
  }
  return bVar3;
}

Assistant:

bool LexerScanner::checkString (const char* c, int flags)
{
	bool r = strncmp (m_position, c, strlen (c)) == 0;

	// There is to be a non-symbol character after words
	if (r and (flags & FCheckWord) and IsSymbolCharacter (m_position[strlen (c)], true))
		r = false;

	// Advance the cursor unless we want to just peek
	if (r and !(flags & FCheckPeek))
		m_position += strlen (c);

	return r;
}